

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O0

void __thiscall aalcalc::getmaxsummaryid(aalcalc *this,string *path)

{
  FILE *__stream;
  uint uVar1;
  char *pcVar2;
  FILE *__stream_00;
  undefined8 uVar3;
  char local_1058 [4];
  int ret;
  char line [4096];
  FILE *fin;
  string filename;
  string *path_local;
  aalcalc *this_local;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fin,
                 (char *)path);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  __stream_00 = fopen(pcVar2,"rb");
  __stream = _stderr;
  if (__stream_00 == (FILE *)0x0) {
    uVar3 = std::__cxx11::string::c_str();
    fprintf(__stream,"FATAL:%s: cannot open %s\n","getmaxsummaryid",uVar3);
    exit(1);
  }
  pcVar2 = fgets(local_1058,0x1000,__stream_00);
  if ((pcVar2 != (char *)0x0) &&
     (uVar1 = __isoc99_sscanf(local_1058,"%d",&this->max_summary_id_), uVar1 != 1)) {
    fprintf(_stderr,"FATAL:Invalid data in line %d:\n%s %d",1,local_1058,(ulong)uVar1);
    exit(-1);
  }
  fclose(__stream_00);
  std::__cxx11::string::~string((string *)&fin);
  return;
}

Assistant:

void aalcalc::getmaxsummaryid(std::string &path)
{
	std::string filename = path + "max_summary_id.idx";
	FILE *fin = fopen(filename.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}

	char line[4096];
	if (fgets(line, sizeof(line), fin) != 0)
	{
		int ret = sscanf(line, "%d", &max_summary_id_);
		if (ret != 1) {
			fprintf(stderr, "FATAL:Invalid data in line %d:\n%s %d", 1, line, ret);
			exit(-1);
		}		
	}

	fclose(fin);
}